

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t default_decompress_chunk(exr_decode_pipeline_t *decode)

{
  void *unpackbufptr;
  long in_RDI;
  uint64_t sampsize;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  void *in_stack_ffffffffffffffd0;
  size_t packsz;
  char *packbufptr;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  packbufptr = *(char **)(in_RDI + 0x10);
  if (packbufptr == (char *)0x0) {
    eVar1 = 2;
  }
  else if (*packbufptr == '\0') {
    if ((*(int *)(in_RDI + 0xc) < 0) || (*(int *)(packbufptr + 0xc4) <= *(int *)(in_RDI + 0xc))) {
      eVar1 = (**(code **)(packbufptr + 0x48))
                        (packbufptr,4,"Part index (%d) out of range",*(undefined4 *)(in_RDI + 0xc));
    }
    else {
      packsz = *(size_t *)(*(long *)(packbufptr + 0x1d8) + (long)*(int *)(in_RDI + 0xc) * 8);
      if ((*(int *)(packsz + 4) == 2) || (*(int *)(packsz + 4) == 3)) {
        unpackbufptr = (void *)((long)*(int *)(in_RDI + 0x28) * (long)*(int *)(in_RDI + 0x24) * 4);
        in_stack_ffffffffffffffd0 = unpackbufptr;
        eVar1 = decompress_data((_internal_exr_context *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (exr_compression_t)((ulong)in_RDI >> 0x20),
                                (exr_decode_pipeline_t *)(ulong)in_stack_ffffffffffffffe8,packbufptr
                                ,packsz,unpackbufptr,(size_t)part);
        if (eVar1 != 0) {
          eVar1 = (**(code **)(packbufptr + 0x48))
                            (packbufptr,eVar1,"Unable to decompress sample table %lu -> %lu",
                             *(undefined8 *)(in_RDI + 0x50),in_stack_ffffffffffffffd0,
                             *(code **)(packbufptr + 0x48),unpackbufptr);
          return eVar1;
        }
        if ((*(ushort *)(in_RDI + 10) & 4) != 0) {
          return 0;
        }
      }
      eVar1 = decompress_data((_internal_exr_context *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (exr_compression_t)((ulong)in_RDI >> 0x20),
                              (exr_decode_pipeline_t *)(ulong)in_stack_ffffffffffffffe8,packbufptr,
                              packsz,in_stack_ffffffffffffffd0,(size_t)part);
      if (eVar1 == 0) {
        eVar1 = 0;
      }
      else {
        eVar1 = (**(code **)(packbufptr + 0x48))
                          (packbufptr,eVar1,"Unable to decompress image data %lu -> %lu",
                           *(undefined8 *)(in_RDI + 0x38),*(undefined8 *)(in_RDI + 0x40));
      }
    }
  }
  else {
    eVar1 = (**(code **)(packbufptr + 0x38))(packbufptr,7);
  }
  return eVar1;
}

Assistant:

static exr_result_t
default_decompress_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        uint64_t sampsize =
            (((uint64_t) decode->chunk.width) *
             ((uint64_t) decode->chunk.height));
        sampsize *= sizeof (int32_t);

        rv = decompress_data (
            pctxt,
            part->comp_type,
            decode,
            decode->packed_sample_count_table,
            decode->chunk.sample_count_table_size,
            decode->sample_count_table,
            sampsize);

        if (rv != EXR_ERR_SUCCESS)
        {
            return pctxt->print_error (
                pctxt,
                rv,
                "Unable to decompress sample table %" PRIu64 " -> %" PRIu64,
                decode->chunk.sample_count_table_size,
                (uint64_t) sampsize);
        }
        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;
    }

    if (rv == EXR_ERR_SUCCESS)
        rv = decompress_data (
            pctxt,
            part->comp_type,
            decode,
            decode->packed_buffer,
            decode->chunk.packed_size,
            decode->unpacked_buffer,
            decode->chunk.unpacked_size);

    if (rv != EXR_ERR_SUCCESS)
    {
        return pctxt->print_error (
            pctxt,
            rv,
            "Unable to decompress image data %" PRIu64 " -> %" PRIu64,
            decode->chunk.packed_size,
            decode->chunk.unpacked_size);
    }
    return rv;
}